

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

LY_ERR lyd_validate_node_when
                 (lyd_node *tree,lyd_node *node,lysc_node *schema,uint32_t xpath_options,
                 lysc_when **disabled)

{
  lysc_node *plVar1;
  LY_ERR LVar2;
  lysc_when **pplVar3;
  lys_module *plVar4;
  lysc_when *plVar5;
  LY_ERR ret__;
  lyd_node_inner *cur_node;
  lysc_when *plVar6;
  lyxp_set xp_set;
  
  if (node->schema != schema && node->schema != (lysc_node *)0x0) {
    __assert_fail("!node->schema || (node->schema == schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0xfd,
                  "LY_ERR lyd_validate_node_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, const struct lysc_when **)"
                 );
  }
  *disabled = (lysc_when *)0x0;
  do {
    pplVar3 = lysc_node_when(schema);
    plVar6 = (lysc_when *)0x0;
    while( true ) {
      if (pplVar3 == (lysc_when **)0x0) {
        plVar5 = (lysc_when *)0x0;
      }
      else {
        plVar5 = pplVar3[-1];
      }
      if (plVar5 <= plVar6) break;
      plVar5 = pplVar3[(long)plVar6];
      plVar1 = plVar5->context;
      cur_node = (lyd_node_inner *)node;
      if (plVar1 != schema) {
        cur_node = node->parent;
        if (plVar1 == (lysc_node *)0x0 && cur_node == (lyd_node_inner *)0x0) {
          cur_node = (lyd_node_inner *)0x0;
        }
        else if (plVar1 != (cur_node->field_0).node.schema) {
          __assert_fail("(!when->context && !node->parent) || (when->context == node->parent->schema)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,0x10c,
                        "LY_ERR lyd_validate_node_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, const struct lysc_when **)"
                       );
        }
      }
      memset(&xp_set,0,0x90);
      plVar4 = (lys_module *)&node[2].schema;
      if (node->schema != (lysc_node *)0x0) {
        plVar4 = node->schema->module;
      }
      LVar2 = lyxp_eval(plVar4->ctx,plVar5->cond,schema->module,LY_VALUE_SCHEMA_RESOLVED,
                        plVar5->prefixes,(lyd_node *)cur_node,(lyd_node *)cur_node,tree,
                        (lyxp_var *)0x0,&xp_set,xpath_options | 2);
      lyxp_set_cast(&xp_set,LYXP_SET_BOOLEAN);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      plVar6 = (lysc_when *)((long)&plVar6->cond + 1);
      if (xp_set.val.bln == '\0') {
        *disabled = plVar5;
        return LY_SUCCESS;
      }
    }
    schema = schema->parent;
    if ((schema == (lysc_node *)0x0) || ((schema->nodetype & 0x82) == 0)) {
      return LY_SUCCESS;
    }
  } while( true );
}

Assistant:

static LY_ERR
lyd_validate_node_when(const struct lyd_node *tree, const struct lyd_node *node, const struct lysc_node *schema,
        uint32_t xpath_options, const struct lysc_when **disabled)
{
    LY_ERR r;
    const struct lyd_node *ctx_node;
    struct lyxp_set xp_set;
    LY_ARRAY_COUNT_TYPE u;

    assert(!node->schema || (node->schema == schema));

    *disabled = NULL;

    do {
        const struct lysc_when *when;
        struct lysc_when **when_list = lysc_node_when(schema);

        LY_ARRAY_FOR(when_list, u) {
            when = when_list[u];

            /* get context node */
            if (when->context == schema) {
                ctx_node = node;
            } else {
                assert((!when->context && !node->parent) || (when->context == node->parent->schema));
                ctx_node = lyd_parent(node);
            }

            /* evaluate when */
            memset(&xp_set, 0, sizeof xp_set);
            r = lyxp_eval(LYD_CTX(node), when->cond, schema->module, LY_VALUE_SCHEMA_RESOLVED, when->prefixes,
                    ctx_node, ctx_node, tree, NULL, &xp_set, LYXP_SCHEMA | xpath_options);
            lyxp_set_cast(&xp_set, LYXP_SET_BOOLEAN);

            /* return error or LY_EINCOMPLETE for dependant unresolved when */
            LY_CHECK_RET(r);

            if (!xp_set.val.bln) {
                /* false when */
                *disabled = when;
                return LY_SUCCESS;
            }
        }

        schema = schema->parent;
    } while (schema && (schema->nodetype & (LYS_CASE | LYS_CHOICE)));

    return LY_SUCCESS;
}